

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswPairs.c
# Opt level: O3

Aig_Man_t * Ssw_SignalCorrespondeceTestPairs(Aig_Man_t *pAig)

{
  uint uVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  Aig_Man_t *pAig2;
  Vec_Int_t *p;
  int *piVar5;
  Vec_Int_t *p_00;
  Aig_Man_t *p_01;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  char *format;
  int iVar9;
  Vec_Int_t *__size;
  Aig_Man_t *pAVar10;
  Vec_Ptr_t *pVVar11;
  ulong uVar12;
  timespec ts_1;
  Ssw_Pars_t Pars;
  long local_f0;
  timespec local_e8;
  Ssw_Pars_t local_d8;
  
  iVar4 = clock_gettime(3,(timespec *)&local_d8);
  if (iVar4 < 0) {
    local_f0 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_d8._8_8_),8);
    local_f0 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_d8._0_8_ * -1000000;
  }
  Ssw_ManSetDefaultParams(&local_d8);
  local_d8.fVerbose = 1;
  pAig2 = Ssw_SignalCorrespondence(pAig,&local_d8);
  pVVar11 = pAig->vObjs;
  uVar1 = pVVar11->nSize;
  uVar12 = (ulong)uVar1;
  p = (Vec_Int_t *)malloc(0x10);
  uVar8 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar8 = uVar1;
  }
  p->nSize = 0;
  p->nCap = uVar8;
  if (uVar8 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)(int)uVar8 * 4);
  }
  p->pArray = piVar5;
  __size = (Vec_Int_t *)&DAT_00000010;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nSize = 0;
  p_00->nCap = uVar8;
  if (uVar8 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    __size = (Vec_Int_t *)((long)(int)uVar8 << 2);
    piVar5 = (int *)malloc((size_t)__size);
  }
  uVar7 = 0;
  iVar4 = (int)__size;
  p_00->pArray = piVar5;
  if (0 < (int)uVar1) {
    lVar6 = 0;
    do {
      pvVar2 = pVVar11->pArray[lVar6];
      if (((pvVar2 != (void *)0x0) &&
          (uVar12 = *(ulong *)((long)pvVar2 + 0x28) & 0xfffffffffffffffe, uVar12 != 0)) &&
         (pVVar3 = pAig2->vObjs, pVVar3 != (Vec_Ptr_t *)0x0)) {
        uVar1 = *(uint *)(uVar12 + 0x24);
        if (((int)uVar1 < 0) || (pVVar3->nSize <= (int)uVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if (pVVar3->pArray[uVar1] != (void *)0x0) {
          Vec_IntPush(p,*(int *)((long)pvVar2 + 0x24));
          __size = p_00;
          Vec_IntPush(p_00,*(int *)(uVar12 + 0x24));
          pVVar11 = pAig->vObjs;
        }
      }
      iVar4 = (int)__size;
      lVar6 = lVar6 + 1;
      uVar12 = (ulong)pVVar11->nSize;
    } while (lVar6 < (long)uVar12);
    uVar7 = (ulong)(uint)p->nSize;
  }
  Abc_Print(iVar4,"Recorded %d pairs (before: %d  after: %d).\n",uVar7,uVar12 & 0xffffffff,
            (ulong)(uint)pAig2->vObjs->nSize);
  p_01 = Ssw_SignalCorrespondenceWithPairs(pAig,pAig2,p,p_00,&local_d8);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
  }
  free(p);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  pAVar10 = p_01;
  iVar4 = Ssw_MiterStatus(p_01,1);
  iVar9 = (int)pAVar10;
  if (iVar4 == 0) {
    format = "Verification failed with the counter-example.  ";
  }
  else {
    if (iVar4 != 1) {
      Abc_Print(iVar9,"Verification UNDECIDED. Remaining registers %d (total %d).  ",
                (ulong)(uint)p_01->nRegs,(ulong)(uint)(pAig2->nRegs + pAig->nRegs));
      goto LAB_005ef9f5;
    }
    format = "Verification successful.  ";
  }
  Abc_Print(iVar9,format);
LAB_005ef9f5:
  Abc_Print(iVar9,"%s =","Time");
  iVar9 = 3;
  iVar4 = clock_gettime(3,&local_e8);
  if (iVar4 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_e8.tv_nsec / 1000 + local_e8.tv_sec * 1000000;
  }
  Abc_Print(iVar9,"%9.2f sec\n",(double)(lVar6 + local_f0) / 1000000.0);
  Aig_ManStop(pAig2);
  return p_01;
}

Assistant:

Aig_Man_t * Ssw_SignalCorrespondeceTestPairs( Aig_Man_t * pAig )
{
    Aig_Man_t * pAigNew, * pAigRes;
    Ssw_Pars_t Pars, * pPars = &Pars;
    Vec_Int_t * vIds1, * vIds2;
    Aig_Obj_t * pObj, * pRepr;
    int RetValue, i;
    abctime clk = Abc_Clock();
    Ssw_ManSetDefaultParams( pPars );
    pPars->fVerbose = 1;
    pAigNew = Ssw_SignalCorrespondence( pAig, pPars );
    // record pairs of equivalent nodes
    vIds1 = Vec_IntAlloc( Aig_ManObjNumMax(pAig) );
    vIds2 = Vec_IntAlloc( Aig_ManObjNumMax(pAig) );
    Aig_ManForEachObj( pAig, pObj, i )
    {
        pRepr = Aig_Regular((Aig_Obj_t *)pObj->pData);
        if ( pRepr == NULL )
            continue;
        if ( Aig_ManObj(pAigNew, pRepr->Id) == NULL )
            continue;
/*
        if ( Aig_ObjIsNode(pObj) )
            Abc_Print( 1, "n " );
        else if ( Saig_ObjIsPi(pAig, pObj) )
            Abc_Print( 1, "pi " );
        else if ( Saig_ObjIsLo(pAig, pObj) )
            Abc_Print( 1, "lo " );
*/
        Vec_IntPush( vIds1, Aig_ObjId(pObj) );
        Vec_IntPush( vIds2, Aig_ObjId(pRepr) );
    }
    Abc_Print( 1, "Recorded %d pairs (before: %d  after: %d).\n", Vec_IntSize(vIds1), Aig_ManObjNumMax(pAig), Aig_ManObjNumMax(pAigNew) );
    // try the new AIGs
    pAigRes = Ssw_SignalCorrespondenceWithPairs( pAig, pAigNew, vIds1, vIds2, pPars );
    Vec_IntFree( vIds1 );
    Vec_IntFree( vIds2 );
    // report the results
    RetValue = Ssw_MiterStatus( pAigRes, 1 );
    if ( RetValue == 1 )
        Abc_Print( 1, "Verification successful.  " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "Verification failed with the counter-example.  " );
    else
        Abc_Print( 1, "Verification UNDECIDED. Remaining registers %d (total %d).  ",
            Aig_ManRegNum(pAigRes), Aig_ManRegNum(pAig) + Aig_ManRegNum(pAigNew) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    // cleanup
    Aig_ManStop( pAigNew );
    return pAigRes;
}